

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void readSOF(FILE *f)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uchar v [3];
  undefined2 local_3b;
  byte local_39;
  FILE *local_38;
  
  EnterNewSection(f,"SOF");
  fseek((FILE *)f,1,1);
  fread(&local_3b,1,2,(FILE *)f);
  image_0 = (uint)(ushort)(local_3b << 8 | local_3b >> 8);
  fread(&local_3b,1,2,(FILE *)f);
  image_1 = (uint)(ushort)(local_3b << 8 | local_3b >> 8);
  printf(anon_var_dwarf_2e98,(ulong)image_0);
  local_38 = (FILE *)f;
  fseek((FILE *)f,1,1);
  iVar4 = 3;
  do {
    fread(&local_3b,1,3,local_38);
    bVar2 = (byte)local_3b;
    uVar5 = (ulong)(byte)local_3b;
    printf(anon_var_dwarf_2eaf,uVar5);
    uVar6 = (uint)local_3b._1_1_;
    bVar1 = local_3b._1_1_ >> 4;
    printf(anon_var_dwarf_2ec6,(ulong)bVar1);
    uVar6 = uVar6 & 0xf;
    printf(anon_var_dwarf_2edd,(ulong)uVar6);
    bVar3 = local_39;
    printf(anon_var_dwarf_2ee8,(ulong)local_39);
    subVector[uVar5].id = bVar2;
    subVector[uVar5].width = bVar1;
    subVector[uVar5].height = (byte)uVar6;
    if ((byte)uVar6 < maxHeight) {
      uVar6 = (uint)maxHeight;
    }
    if (bVar1 < maxWidth) {
      bVar1 = maxWidth;
    }
    subVector[uVar5].quant = bVar3;
    maxHeight = (uchar)uVar6;
    maxWidth = bVar1;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

void readSOF(FILE *f) {
    unsigned int len = EnterNewSection(f, "SOF");
    fseek(f, 1, SEEK_CUR); // 精度
    unsigned char v[3];
    fread(v, 1, 2, f);
    image.height = v[0] * 256 + v[1];
    fread(v, 1, 2, f);
    image.width = v[0] * 256 + v[1];
    printf("高*寬: %d*%d\n", image.height, image.width);
    fseek(f, 1, SEEK_CUR); // 顏色分量數，固定為3
    for (int i = 0; i < 3; i++) {
        fread(v, 1, 3, f);
        printf("顏色分量ID：%d\n", v[0]);
        printf("水平採樣因子：%d\n", v[1] >> 4);
        printf("垂直採樣因子：%d\n", v[1] & 0x0F);
        printf("量化表ID：%d\n", v[2]);
        subVector[v[0]].id = v[0];
        subVector[v[0]].width = v[1] >> 4;
        subVector[v[0]].height = v[1] & 0x0F;
        subVector[v[0]].quant = v[2];
        maxHeight = (maxHeight > subVector[v[0]].height ? maxHeight : subVector[v[0]].height);
        maxWidth = (maxWidth > subVector[v[0]].width ? maxWidth : subVector[v[0]].width);
    }
}